

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Query_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::Minefield_Query_PDU::Minefield_Query_PDU(Minefield_Query_PDU *this)

{
  Minefield_Header::Minefield_Header(&this->super_Minefield_Header);
  (this->super_Minefield_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Minefield_Query_PDU_00223988;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_ReqID);
  this->m_ui8ReqID = '\0';
  this->m_ui8NumPerimPoints = '\0';
  this->m_ui8Padding1 = '\0';
  this->m_ui8NumSensTyp = '\0';
  DATA_TYPE::MinefieldDataFilter::MinefieldDataFilter(&this->m_DataFilter);
  DATA_TYPE::EntityType::EntityType(&this->m_MineTypFilter);
  this->m_ui16Padding1 = 0;
  (this->m_vPoints).
  super__Vector_base<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vPoints).
  super__Vector_base<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vPoints).
  super__Vector_base<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vui16SensorTypes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vui16SensorTypes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vui16SensorTypes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_bNeedsPadding = false;
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui8PDUType = '&';
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength = 0x28;
  return;
}

Assistant:

Minefield_Query_PDU::Minefield_Query_PDU() :
    m_ui8ReqID( 0 ),
    m_ui8NumPerimPoints( 0 ),
    m_ui8Padding1( 0 ),
    m_ui8NumSensTyp( 0 ),
    m_bNeedsPadding( 0 ),
    m_ui16Padding1( 0 )
{
    m_ui8PDUType = MinefieldQuery_PDU_Type;
    m_ui16PDULength = MINEFIELD_QUERY_PDU_SIZE;
}